

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void GenCodeCmdCall(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  uint uVar1;
  uint uVar2;
  x86XmmReg reg;
  x86XmmReg reg1;
  uint *puVar3;
  ulong uVar4;
  
  if (((ulong)cmd >> 0x20 != 0xffffffff) && (ctx->exFunctions[(ulong)cmd >> 0x20].builtinIndex == 1)
     ) {
    puVar3 = ctx->exRegVmConstants;
    uVar4 = (ulong)cmd >> 0x18 & 0xff | (ulong)((cmd._2_4_ & 0xff) << 8) |
            (ulong)((cmd._1_4_ & 0xff) << 0x10);
    if ((puVar3[uVar4] == 3) && ((puVar3[uVar4 + 2] == 5 && (puVar3[uVar4 + 4] == 1)))) {
      uVar1 = puVar3[uVar4 + 1];
      uVar2 = puVar3[uVar4 + 5];
      reg = CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,uVar1 << 3,true)
      ;
      if (reg == rXmmRegCount) {
        reg = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
        EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg,sQWORD,rEBX,uVar1 << 3);
      }
      else {
        CodeGenGenericContext::LockXmmReg(&ctx->ctx,reg);
      }
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_REG(&ctx->ctx,o_sqrtsd,reg1,reg);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uVar2 & 0xff) << 3,reg1);
      return;
    }
  }
  ctx->vmState->callWrap = CallWrap;
  puVar3 = GetCodeCmdCallPrologue
                     (ctx,cmd._3_4_ & 0xff | (cmd._2_4_ & 0xff) << 8 | (cmd._1_4_ & 0xff) << 0x10);
  uVar1 = *puVar3;
  uVar2 = puVar3[1];
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rR13,0x178);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEAX,cmd.argument * 8);
  EMIT_OP_REG_NUM(&ctx->ctx,o_cmp64,rEAX,0);
  EMIT_OP_LABEL(&ctx->ctx,o_je,ctx->labelCount,0,0);
  EMIT_OP_REG(&ctx->ctx,o_call,rEAX);
  EMIT_OP_LABEL(&ctx->ctx,o_jmp,ctx->labelCount + 1,0,0);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR13);
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rESI,cmd.argument);
  EMIT_REG_READ(&ctx->ctx,rEDI);
  EMIT_REG_READ(&ctx->ctx,rESI);
  EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xd0);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  GetCodeCmdCallEpilogue(ctx,puVar3 + 2,(uchar)uVar1,(uchar)uVar2);
  return;
}

Assistant:

void GenCodeCmdCall(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	if(cmd.argument != ~0u && ctx.exFunctions[cmd.argument].builtinIndex == NULLC_BUILTIN_SQRT)
	{
		unsigned *microcode = ctx.exRegVmConstants + ((cmd.rA << 16) | (cmd.rB << 8) | cmd.rC);

		if(*microcode++ == rvmiPushQword)
		{
			unsigned sourceReg = *microcode++;

			if(*microcode++ == (NULLC_PTR_SIZE == 8 ? rvmiPushImmq : rvmiPushImm))
			{
				microcode++;

				if(*microcode++ == rvmiCall)
				{
					unsigned char resultReg = *microcode++ & 0xff;

					x86XmmReg source = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, sourceReg * 8, true);

					if(source == rXmmRegCount)
					{
						source = ctx.ctx.GetXmmReg();

						EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, source, sQWORD, rREG, sourceReg * 8); // Load double value
					}
					else
					{
						ctx.ctx.LockXmmReg(source);
					}

					ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

					x86XmmReg destination = ctx.ctx.GetXmmReg();

					EMIT_OP_REG_REG(ctx.ctx, o_sqrtsd, destination, source);
					EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, resultReg * 8, destination); // Store double to target

					return;
				}
			}
		}
	}

	ctx.vmState->callWrap = CallWrap;

	unsigned *microcode = GetCodeCmdCallPrologue(ctx, (cmd.rA << 16) | (cmd.rB << 8) | cmd.rC);

	unsigned char resultReg = *microcode++ & 0xff;
	unsigned char resultType = *microcode++ & 0xff;

#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rR13, nullcOffsetOf(ctx.vmState, functionAddress));
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rRAX, cmd.argument * sizeof(void*));
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp64, rRAX, 0);

	EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount, false);

	EMIT_OP_REG(ctx.ctx, o_call, rRAX);
	EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount + 1, false);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG_REG(ctx.ctx, o_mov64, rArg1, rR13);
	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rArg2, cmd.argument);
	EMIT_REG_READ(ctx.ctx, rArg1);
	EMIT_REG_READ(ctx.ctx, rArg2);
	EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, nullcOffsetOf(ctx.vmState, callWrap));

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;
#else
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, cmd.argument * sizeof(void*) + (uintptr_t)ctx.vmState->functionAddress);
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp, rEAX, 0);

	EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount, false);

	EMIT_OP_REG(ctx.ctx, o_call, rEAX);
	EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount + 1, false);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_NUM(ctx.ctx, o_push, cmd.argument);
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->callWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 8);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;
#endif

	GetCodeCmdCallEpilogue(ctx, microcode, resultReg, resultType);
}